

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_gsv_text.cpp
# Opt level: O1

void __thiscall agg::gsv_text::gsv_text(gsv_text *this)

{
  this->m_x = 0.0;
  this->m_y = 0.0;
  this->m_start_x = 0.0;
  this->m_width = 10.0;
  this->m_height = 0.0;
  this->m_space = 0.0;
  this->m_line_space = 0.0;
  this->m_text = this->m_chr;
  (this->m_text_buf).m_array = (char *)0x0;
  (this->m_text_buf).m_size = 0;
  this->m_cur_chr = this->m_chr;
  this->m_font = &gsv_default_font;
  (this->m_loaded_font).m_array = (char *)0x0;
  (this->m_loaded_font).m_size = 0;
  this->m_status = initial;
  this->m_big_endian = false;
  this->m_flip = false;
  this->m_chr[0] = '\0';
  this->m_chr[1] = '\0';
  return;
}

Assistant:

gsv_text::gsv_text() :
      m_x(0.0),
      m_y(0.0),
      m_start_x(0.0),
      m_width(10.0),
      m_height(0.0),
      m_space(0.0),
      m_line_space(0.0),
      m_text(m_chr),
      m_text_buf(),
      m_cur_chr(m_chr),
      m_font(gsv_default_font),
      m_loaded_font(),
      m_status(initial),
      m_big_endian(false),
      m_flip(false)
    {
        m_chr[0] = m_chr[1] = 0;

        int t = 1;
        if(*(char*)&t == 0) m_big_endian = true;
    }